

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineArguments.cpp
# Opt level: O2

bool __thiscall
CommandLineArguments::addGroupDotNameFilter(CommandLineArguments *this,int ac,char **av,int *i)

{
  size_t sVar1;
  TestFilter *pTVar2;
  SimpleString *pSVar3;
  SimpleString *this_00;
  int ac_00;
  SimpleString SStack_68;
  SimpleStringCollection collection;
  SimpleString groupDotName;
  
  ac_00 = 0x1448a7;
  SimpleString::SimpleString((SimpleString *)&collection,"-t");
  getParameterField((CommandLineArguments *)&groupDotName,ac_00,(char **)(ulong)(uint)ac,(int *)av,
                    (SimpleString *)i);
  SimpleString::~SimpleString((SimpleString *)&collection);
  SimpleStringCollection::SimpleStringCollection(&collection);
  SimpleString::SimpleString(&SStack_68,".");
  SimpleString::split(&groupDotName,&SStack_68,&collection);
  SimpleString::~SimpleString(&SStack_68);
  sVar1 = SimpleStringCollection::size(&collection);
  if (sVar1 == 2) {
    pTVar2 = (TestFilter *)
             operator_new(0x20,
                          "/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/build_O2/CMake/cpputest/cpputest-src/src/CppUTest/CommandLineArguments.cpp"
                          ,0x10f);
    pSVar3 = SimpleStringCollection::operator[](&collection,0);
    this_00 = SimpleStringCollection::operator[](&collection,0);
    SimpleString::size(this_00);
    SimpleString::subString(&SStack_68,(size_t)pSVar3,0);
    TestFilter::TestFilter(pTVar2,&SStack_68);
    pTVar2 = TestFilter::add(pTVar2,this->groupFilters_);
    this->groupFilters_ = pTVar2;
    SimpleString::~SimpleString(&SStack_68);
    pTVar2 = (TestFilter *)
             operator_new(0x20,
                          "/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/build_O2/CMake/cpputest/cpputest-src/src/CppUTest/CommandLineArguments.cpp"
                          ,0x110);
    pSVar3 = SimpleStringCollection::operator[](&collection,1);
    TestFilter::TestFilter(pTVar2,pSVar3);
    pTVar2 = TestFilter::add(pTVar2,this->nameFilters_);
    this->nameFilters_ = pTVar2;
  }
  SimpleStringCollection::~SimpleStringCollection(&collection);
  SimpleString::~SimpleString(&groupDotName);
  return sVar1 == 2;
}

Assistant:

bool CommandLineArguments::addGroupDotNameFilter(int ac, const char *const *av, int& i)
{
    SimpleString groupDotName = getParameterField(ac, av, i, "-t");
    SimpleStringCollection collection;
    groupDotName.split(".", collection);

    if (collection.size() != 2) return false;

    groupFilters_ = (new TestFilter(collection[0].subString(0, collection[0].size()-1)))->add(groupFilters_);
    nameFilters_ = (new TestFilter(collection[1]))->add(nameFilters_);
    return true;
}